

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O2

void __thiscall S2RegionCoverer::GetInitialCandidates(S2RegionCoverer *this)

{
  int iVar1;
  pointer pSVar2;
  Candidate *candidate;
  vector<S2CellId,_std::allocator<S2CellId>_> *__range1;
  pointer pSVar3;
  vector<S2CellId,_std::allocator<S2CellId>_> cells;
  S2RegionCoverer tmp_coverer;
  S2Cell local_58;
  
  S2RegionCoverer(&tmp_coverer);
  iVar1 = (this->options_).max_cells_;
  tmp_coverer.options_.max_cells_ = 4;
  if (iVar1 < 4) {
    tmp_coverer.options_.max_cells_ = iVar1;
  }
  Options::set_max_level(&tmp_coverer.options_,(this->options_).max_level_);
  cells.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cells.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cells.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  GetFastCovering(&tmp_coverer,this->region_,&cells);
  AdjustCellLevels(this,&cells);
  pSVar2 = cells.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar3 = cells.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar3 != pSVar2; pSVar3 = pSVar3 + 1) {
    S2Cell::S2Cell(&local_58,(S2CellId)pSVar3->id_);
    candidate = NewCandidate(this,&local_58);
    AddCandidate(this,candidate);
  }
  std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base
            (&cells.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>);
  ~S2RegionCoverer(&tmp_coverer);
  return;
}

Assistant:

void S2RegionCoverer::GetInitialCandidates() {
  // Optimization: start with a small (usually 4 cell) covering of the
  // region's bounding cap.
  S2RegionCoverer tmp_coverer;
  tmp_coverer.mutable_options()->set_max_cells(min(4, options_.max_cells()));
  tmp_coverer.mutable_options()->set_max_level(options_.max_level());
  vector<S2CellId> cells;
  tmp_coverer.GetFastCovering(*region_, &cells);
  AdjustCellLevels(&cells);
  for (S2CellId cell_id : cells) {
    AddCandidate(NewCandidate(S2Cell(cell_id)));
  }
}